

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O0

void Memory::
     DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,HashTable<AddPropertyCacheBucket,Memory::ArenaAllocator>>
               (AllocatorType *allocator,
               HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *obj,size_t plusSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  long *plVar5;
  long extraout_RDX;
  code *local_48;
  FreeFuncType freeFunc;
  size_t plusSize_local;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *obj_local;
  AllocatorType *allocator_local;
  
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>::~HashTable(obj);
  if (plusSize + 0x20 < 0x20) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x130,"(sizeof(T) + plusSize >= sizeof(T))",
                       "sizeof(T) + plusSize >= sizeof(T)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_48 = (code *)TypeAllocatorFunc<Memory::ArenaAllocator,_HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>_>
                     ::GetFreeFunc();
  plVar5 = (long *)((long)&(allocator->
                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>)
                           .super_Allocator.outOfMemoryFunc + extraout_RDX);
  if (((ulong)local_48 & 1) != 0) {
    local_48 = *(code **)(local_48 + *plVar5 + -1);
  }
  sVar4 = _AllocatorDelete<HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator>,_(Memory::AllocatorDeleteFlags)0>
          ::Size(plusSize);
  (*local_48)(plVar5,obj,sVar4);
  return;
}

Assistant:

void DeleteObject(typename AllocatorInfo<TAllocator, T>::AllocatorType * allocator, T * obj, size_t plusSize)
{
    obj->~T();

    // DeleteObject can only be called when an object is allocated successfully.
    // So the add should never overflow
    Assert(sizeof(T) + plusSize >= sizeof(T));

    auto freeFunc = AllocatorInfo<TAllocator, T>::InstAllocatorFunc::GetFreeFunc(); // Use InstAllocatorFunc
    (allocator->*freeFunc)(
        (void*)obj, _AllocatorDelete<T, deleteFlags>::Size(plusSize));
}